

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx2::create_group_ops
          (ConvolutionDepthWise_x86_avx2 *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _func_int *p_Var5;
  int *piVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 *puVar10;
  void **ppvVar11;
  int i;
  uint uVar12;
  pointer ppLVar13;
  Layer *pLVar14;
  long lVar15;
  _func_int **pp_Var16;
  ulong uVar17;
  int iVar18;
  pointer ppLVar19;
  long lVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 in_ZMM7 [64];
  Mat weight_data_int8_scales_g;
  Mat weight_data_g;
  ParamDict pd;
  Mat local_368;
  void *local_318;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 local_308;
  undefined4 uStack_304;
  int local_300;
  Allocator *local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  int local_2e0;
  size_t local_2d8;
  int local_2cc;
  void *local_2c8;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  int local_2b0;
  Allocator *local_2a8;
  uint uStack_2a0;
  int iStack_29c;
  uint uStack_298;
  uint uStack_294;
  uint uStack_290;
  size_t local_288;
  void *local_278;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 local_268;
  undefined4 uStack_264;
  int local_260;
  undefined1 auStack_25c [4];
  Allocator *local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  int local_240;
  undefined1 auStack_23c [4];
  size_t local_238;
  undefined1 local_228 [48];
  undefined8 uStack_1f8;
  int local_1f0 [2];
  size_t local_1e8;
  void *local_1e0;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  int iStack_1c8;
  Allocator *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  uint local_1a8;
  size_t local_1a0;
  void *local_198;
  int *piStack_190;
  undefined8 uStack_188;
  int iStack_180;
  Allocator *local_178;
  undefined8 local_170 [2];
  int local_160;
  size_t local_158;
  void *local_150;
  int *piStack_148;
  undefined8 uStack_140;
  int iStack_138;
  Allocator *local_130;
  undefined8 local_128 [2];
  int local_118;
  size_t local_110;
  void *local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  int iStack_f0;
  Allocator *local_e8;
  undefined8 local_e0;
  int iStack_d8;
  int iStack_d4;
  int local_d0;
  size_t local_c8;
  undefined8 *local_c0;
  void **local_b8;
  undefined8 *local_b0;
  void **local_a8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_a0;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  size_t local_88;
  undefined1 *local_80;
  size_t local_78;
  Option *local_70;
  ParamDict local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  ppLVar19 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  p_Var5 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
  iVar18 = *(int *)(&this->field_0xd8 + (long)p_Var5) * *(int *)(&this->field_0xd4 + (long)p_Var5);
  iVar2 = *(int *)(&this->field_0xd0 + (long)p_Var5);
  iVar3 = *(int *)(&this->field_0x108 + (long)p_Var5);
  uVar17 = (long)*(int *)(&this->field_0x104 + (long)p_Var5) / (long)iVar3;
  uVar17 = (long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) / (long)iVar18;
  ppLVar13 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_70 = opt;
  if (0 < (int)((ulong)((long)ppLVar13 - (long)ppLVar19) >> 3)) {
    lVar20 = 0;
    do {
      if (ppLVar19[lVar20] != (Layer *)0x0) {
        (*ppLVar19[lVar20]->_vptr_Layer[1])();
      }
      lVar20 = lVar20 + 1;
      ppLVar19 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar13 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar20 < (int)((ulong)((long)ppLVar13 - (long)ppLVar19) >> 3));
  }
  local_a0 = &this->group_ops;
  if (ppLVar13 != ppLVar19) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar19;
  }
  iVar4 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
  i = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) / iVar4;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_a0,(long)iVar4);
  pp_Var16 = this->_vptr_ConvolutionDepthWise_x86_avx2;
  if (0 < *(int *)(&this->field_0x108 + (long)pp_Var16[-3])) {
    local_80 = &this->field_0x118;
    local_2cc = iVar18 * i *
                (((int)((long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) /
                       (long)(iVar2 / iVar3)) * iVar3) / iVar4);
    local_78 = (size_t)local_2cc;
    local_88 = (size_t)i;
    local_a8 = &local_198;
    local_b0 = local_170;
    local_b8 = &local_150;
    local_c0 = local_128;
    local_98 = 1;
    iStack_94 = 1;
    iStack_90 = 1;
    iStack_8c = 1;
    local_58 = 0x8000000000000000;
    uStack_50 = 0x8000000000000000;
    uStack_48 = 0x8000000000000000;
    uStack_40 = 0x8000000000000000;
    lVar20 = 0;
    do {
      pp_Var16 = pp_Var16 + -3;
      p_Var5 = *pp_Var16;
      lVar15 = *(long *)(&this->field_0x178 + (long)p_Var5);
      local_278 = (void *)(lVar20 * local_78 * lVar15 + *(long *)(&this->field_0x168 + (long)p_Var5)
                          );
      local_260 = *(int *)(&this->field_0x180 + (long)p_Var5);
      local_258 = *(Allocator **)(&this->field_0x188 + (long)p_Var5);
      local_268 = (undefined4)lVar15;
      uStack_264 = (undefined4)((ulong)lVar15 >> 0x20);
      local_250 = CONCAT44((int)local_78,1);
      local_288 = 0;
      local_2c8 = (void *)0x0;
      local_2b8 = 0;
      uStack_2b4 = 0;
      local_2b0 = 0;
      local_2a8 = (Allocator *)0x0;
      iStack_29c = 0;
      bVar21 = *(int *)(&this->field_0x100 + (long)*pp_Var16) != 0;
      if (bVar21) {
        p_Var5 = *pp_Var16;
        lVar15 = *(long *)(&this->field_0x1c0 + (long)p_Var5);
        local_2c8 = (void *)(lVar20 * local_88 * lVar15 +
                            *(long *)(&this->field_0x1b0 + (long)p_Var5));
        local_2b0 = *(int *)(&this->field_0x1c8 + (long)p_Var5);
        local_2a8 = *(Allocator **)(&this->field_0x1d0 + (long)p_Var5);
        local_228._16_4_ = (undefined4)lVar15;
        local_228._20_4_ = (undefined4)((ulong)lVar15 >> 0x20);
        local_288 = local_88;
        uStack_2b4 = local_228._20_4_;
        local_2b8 = local_228._16_4_;
        local_1e8 = 0;
        local_228._0_8_ = (void *)0x0;
        local_228._8_4_ = 0;
        local_228._12_4_ = 0;
        local_228._16_4_ = 0;
        local_228._20_4_ = 0;
        local_228._24_4_ = 0;
        stack0xfffffffffffffe00 = ZEXT816(0);
        local_1f0[0] = 0;
        iStack_29c = i;
        local_228._32_8_ = local_2a8;
      }
      uStack_290 = (uint)bVar21;
      uStack_294 = (uint)bVar21;
      uStack_298 = (uint)bVar21;
      uStack_2a0 = (uint)bVar21;
      local_238 = local_78;
      local_240 = 1;
      uStack_248 = 0x100000001;
      uStack_26c = 0;
      uStack_270 = 0;
      uStack_2bc = 0;
      uStack_2c0 = 0;
      auVar31 = ZEXT1632(in_ZMM7._0_16_);
      pLVar14 = create_layer(6);
      ParamDict::ParamDict(&local_68);
      ParamDict::set(&local_68,0,i);
      ParamDict::set(&local_68,1,
                     *(int *)(&this->field_0xd4 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,0xb,
                     *(int *)(&this->field_0xd8 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,2,
                     *(int *)(&this->field_0xdc +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,0xc,
                     *(int *)(&this->field_0xe0 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,3,
                     *(int *)(&this->field_0xe4 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,0xd,
                     *(int *)(&this->field_0xe8 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,4,0);
      ParamDict::set(&local_68,0xe,0);
      ParamDict::set(&local_68,5,
                     *(int *)(&this->field_0x100 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,6,local_2cc);
      ParamDict::set(&local_68,8,
                     *(int *)(&this->field_0x10c +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,9,
                     *(int *)(&this->field_0x110 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      ParamDict::set(&local_68,10,
                     (Mat *)(local_80 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
      (*pLVar14->_vptr_Layer[2])(pLVar14,&local_68);
      if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) == 0) {
        lVar15 = 0x40;
        auVar23._0_12_ = ZEXT812(0);
        auVar23._12_4_ = 0;
        do {
          *(undefined8 *)(local_228 + lVar15) = 0;
          *(undefined1 (*) [16])((long)&local_268 + lVar15) = auVar23;
          *(undefined1 (*) [16])(auStack_25c + lVar15) = auVar23;
          *(undefined1 (*) [16])((long)&uStack_248 + lVar15) = auVar23;
          *(undefined1 (*) [16])(auStack_23c + lVar15) = auVar23;
          lVar15 = lVar15 + 0x48;
        } while (lVar15 != 0x160);
        piVar6 = (int *)CONCAT44(uStack_26c,uStack_270);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_228._12_4_,local_228._8_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if ((Allocator *)local_228._32_8_ == (Allocator *)0x0) {
              if ((void *)local_228._0_8_ != (void *)0x0) {
                free((void *)local_228._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_228._32_8_)[3])();
            }
          }
        }
        auVar23 = auVar31._0_16_;
        local_228._0_8_ = local_278;
        local_228._8_4_ = uStack_270;
        local_228._12_4_ = uStack_26c;
        local_228._16_4_ = local_268;
        local_228._20_4_ = uStack_264;
        local_228._24_4_ = local_260;
        local_228._32_8_ = local_258;
        uStack_1f8 = uStack_248;
        local_228._40_8_ = local_250;
        local_1f0[0] = local_240;
        local_1e8 = local_238;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) != 0)
        {
          local_368.cstep = 0;
          local_368.data = (void *)0x0;
          local_368.refcount._0_4_ = 0;
          local_368.refcount._4_4_ = 0;
          local_368.elemsize._0_4_ = 0;
          local_368.elemsize._4_4_ = 0;
          local_368.elempack = 0;
          local_368.h = 0;
          local_368.d = 0;
          local_368.c = 0;
          local_368.allocator = (Allocator *)0x0;
          local_368.dims = 0;
          local_368.w = 0;
          Mat::create(&local_368,i,4,(Allocator *)0x0);
          uVar12 = local_368.c * (int)local_368.cstep;
          auVar7 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar8 = vpmovsxbq_avx2(ZEXT416(0x7060504));
          auVar29._8_8_ = uStack_50;
          auVar29._0_8_ = local_58;
          auVar29._16_8_ = uStack_48;
          auVar29._24_8_ = uStack_40;
          auVar31 = vpcmpeqd_avx2(auVar31,auVar31);
          auVar23 = auVar31._0_16_;
          if (0 < (int)uVar12) {
            lVar15 = (ulong)uVar12 - 1;
            auVar27._8_8_ = lVar15;
            auVar27._0_8_ = lVar15;
            auVar27._16_8_ = lVar15;
            auVar27._24_8_ = lVar15;
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) + lVar20 * 4);
            auVar25._4_4_ = uVar1;
            auVar25._0_4_ = uVar1;
            auVar25._8_4_ = uVar1;
            auVar25._12_4_ = uVar1;
            auVar25._16_4_ = uVar1;
            auVar25._20_4_ = uVar1;
            auVar25._24_4_ = uVar1;
            auVar25._28_4_ = uVar1;
            uVar17 = 0;
            do {
              auVar30._8_8_ = uVar17;
              auVar30._0_8_ = uVar17;
              auVar30._16_8_ = uVar17;
              auVar30._24_8_ = uVar17;
              auVar9 = vpor_avx2(auVar30,auVar7);
              auVar30 = vpor_avx2(auVar30,auVar8);
              auVar30 = vpcmpgtq_avx2(auVar30 ^ auVar29,auVar27 ^ auVar29);
              auVar9 = vpcmpgtq_avx2(auVar9 ^ auVar29,auVar27 ^ auVar29);
              auVar30 = vpackssdw_avx2(auVar9,auVar30);
              auVar22 = vpackssdw_avx(SUB3216(auVar30 ^ auVar31,0),SUB3216(auVar30 ^ auVar31,0x10));
              auVar22 = vpshufd_avx(auVar22,0xd8);
              auVar30 = vpmovzxwd_avx2(auVar22);
              auVar30 = vpslld_avx2(auVar30,0x1f);
              auVar30 = vmaskmovps_avx(auVar30,auVar25);
              *(undefined1 (*) [32])((long)local_368.data + uVar17 * 4) = auVar30;
              uVar17 = uVar17 + 8;
            } while ((uVar12 + 7 & 0xfffffff8) != uVar17);
          }
          piVar6 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = (int *)CONCAT44(uStack_1d4,uStack_1d8);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_1c0 == (Allocator *)0x0) {
                if (local_1e0 != (void *)0x0) {
                  free(local_1e0);
                }
              }
              else {
                (*local_1c0->_vptr_Allocator[3])();
              }
            }
          }
          local_1e0 = local_368.data;
          uStack_1d8 = local_368.refcount._0_4_;
          uStack_1d4 = local_368.refcount._4_4_;
          uStack_1d0 = (undefined4)local_368.elemsize;
          uStack_1cc = local_368.elemsize._4_4_;
          iStack_1c8 = local_368.elempack;
          local_1c0 = local_368.allocator;
          local_1b8._4_4_ = local_368.w;
          local_1b8._0_4_ = local_368.dims;
          uStack_1b0._0_4_ = local_368.h;
          uStack_1b0._4_4_ = local_368.d;
          local_1a8 = local_368.c;
          local_1a0 = local_368.cstep;
          p_Var5 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
          lVar15 = *(long *)(&this->field_0x250 + (long)p_Var5);
          local_318 = (void *)(lVar15 * lVar20 + *(long *)(&this->field_0x240 + (long)p_Var5));
          local_300 = *(int *)(&this->field_0x258 + (long)p_Var5);
          local_2f8 = *(Allocator **)(&this->field_0x260 + (long)p_Var5);
          uStack_310 = 0;
          uStack_30c = 0;
          local_308 = (undefined4)lVar15;
          uStack_304 = (undefined4)((ulong)lVar15 >> 0x20);
          local_2f0 = CONCAT44(iStack_94,local_98);
          uStack_2e8._4_4_ = iStack_8c;
          uStack_2e8._0_4_ = iStack_90;
          local_2e0 = 1;
          local_2d8 = 1;
          if (piStack_190 != (int *)0x0) {
            LOCK();
            *piStack_190 = *piStack_190 + -1;
            UNLOCK();
            if (*piStack_190 == 0) {
              if (local_178 == (Allocator *)0x0) {
                if (local_198 != (void *)0x0) {
                  free(local_198);
                }
              }
              else {
                (*local_178->_vptr_Allocator[3])();
              }
            }
          }
          ppvVar11 = local_a8;
          *(undefined8 *)((long)local_a8 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar11 + 0x14) = 0;
          *ppvVar11 = (void *)0x0;
          ppvVar11[1] = (void *)0x0;
          puVar10 = local_b0;
          *local_b0 = 0;
          puVar10[1] = 0;
          *(undefined4 *)(puVar10 + 2) = 0;
          piVar6 = (int *)CONCAT44(uStack_30c,uStack_310);
          local_198 = local_318;
          piStack_190 = (int *)CONCAT44(uStack_30c,uStack_310);
          uStack_188 = CONCAT44(uStack_304,local_308);
          iStack_180 = local_300;
          local_178 = local_2f8;
          local_170[0] = local_2f0;
          local_170[1]._0_4_ = (int)uStack_2e8;
          local_170[1]._4_4_ = uStack_2e8._4_4_;
          local_160 = local_2e0;
          local_158 = local_2d8;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_2f8 == (Allocator *)0x0) {
                if (local_318 != (void *)0x0) {
                  free(local_318);
                }
              }
              else {
                (*local_2f8->_vptr_Allocator[3])();
              }
            }
          }
          local_2d8 = 0;
          local_318 = (void *)0x0;
          uStack_310 = 0;
          uStack_30c = 0;
          local_308 = 0;
          uStack_304 = 0;
          local_300 = 0;
          local_2f0 = 0;
          uStack_2e8 = 0;
          local_2e0 = 0;
          piVar6 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_368.allocator == (Allocator *)0x0) {
                if (local_368.data != (void *)0x0) {
                  free(local_368.data);
                }
              }
              else {
                (*(local_368.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_368.cstep = 0;
          local_368.data = (void *)0x0;
          local_368.refcount._0_4_ = 0;
          local_368.refcount._4_4_ = 0;
          local_368.elemsize._0_4_ = 0;
          local_368.elemsize._4_4_ = 0;
          local_368.elempack = 0;
          local_368.dims = 0;
          local_368.w = 0;
          local_368.h = 0;
          local_368.d = 0;
          local_368.c = 0;
        }
        if (100 < *(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3])
           ) {
          p_Var5 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
          lVar15 = *(long *)(&this->field_0x298 + (long)p_Var5);
          local_368.data = (void *)(lVar15 * lVar20 + *(long *)(&this->field_0x288 + (long)p_Var5));
          local_368.elempack = *(int *)(&this->field_0x2a0 + (long)p_Var5);
          local_368.allocator = *(Allocator **)(&this->field_0x2a8 + (long)p_Var5);
          local_368.refcount._0_4_ = 0;
          local_368.refcount._4_4_ = 0;
          local_368.elemsize._0_4_ = (undefined4)lVar15;
          local_368.elemsize._4_4_ = (undefined4)((ulong)lVar15 >> 0x20);
          local_368.d = iStack_8c;
          local_368.h = iStack_90;
          local_368.dims = local_98;
          local_368.w = iStack_94;
          local_368.c = 1;
          local_368.cstep = 1;
          if (piStack_148 != (int *)0x0) {
            LOCK();
            *piStack_148 = *piStack_148 + -1;
            UNLOCK();
            if (*piStack_148 == 0) {
              if (local_130 == (Allocator *)0x0) {
                if (local_150 != (void *)0x0) {
                  free(local_150);
                }
              }
              else {
                (*local_130->_vptr_Allocator[3])();
              }
            }
          }
          ppvVar11 = local_b8;
          *(undefined8 *)((long)local_b8 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar11 + 0x14) = 0;
          *ppvVar11 = (void *)0x0;
          ppvVar11[1] = (void *)0x0;
          puVar10 = local_c0;
          *local_c0 = 0;
          puVar10[1] = 0;
          *(undefined4 *)(puVar10 + 2) = 0;
          piVar6 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
          local_150 = local_368.data;
          piStack_148 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
          uStack_140 = CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
          iStack_138 = local_368.elempack;
          local_130 = local_368.allocator;
          local_128[0] = CONCAT44(local_368.w,local_368.dims);
          local_128[1]._0_4_ = local_368.h;
          local_128[1]._4_4_ = local_368.d;
          local_118 = local_368.c;
          local_110 = local_368.cstep;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_368.allocator == (Allocator *)0x0) {
                if (local_368.data != (void *)0x0) {
                  free(local_368.data);
                }
              }
              else {
                (*(local_368.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_368.cstep = 0;
          local_368.data = (void *)0x0;
          local_368.refcount._0_4_ = 0;
          local_368.refcount._4_4_ = 0;
          local_368.elemsize._0_4_ = 0;
          local_368.elemsize._4_4_ = 0;
          local_368.elempack = 0;
          local_368.dims = 0;
          local_368.w = 0;
          local_368.h = 0;
          local_368.d = 0;
          local_368.c = 0;
        }
        in_ZMM7 = ZEXT1664(auVar23);
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_368,(Mat *)local_228);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_368);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_368);
        lVar15 = 0xd8;
        do {
          piVar6 = *(int **)(local_228 + lVar15 + 8);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (*(long **)(local_228 + lVar15 + 0x20) == (long *)0x0) {
                if (*(void **)(local_228 + lVar15) != (void *)0x0) {
                  free(*(void **)(local_228 + lVar15));
                }
              }
              else {
                (**(code **)(**(long **)(local_228 + lVar15 + 0x20) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_1e8 + lVar15) = 0;
          *(undefined8 *)(local_228 + lVar15 + 0xc) = 0;
          *(undefined8 *)(local_228 + lVar15 + 0x14) = 0;
          *(undefined8 *)(local_228 + lVar15) = 0;
          *(undefined8 *)(local_228 + lVar15 + 8) = 0;
          *(undefined8 *)(local_228 + lVar15 + 0x28) = 0;
          *(undefined8 *)((long)local_1f0 + lVar15 + -8) = 0;
          *(undefined4 *)((long)local_1f0 + lVar15) = 0;
          lVar15 = lVar15 + -0x48;
        } while (lVar15 != -0x48);
      }
      else {
        lVar15 = 0x40;
        auVar22._0_12_ = ZEXT812(0);
        auVar22._12_4_ = 0;
        do {
          *(undefined8 *)(local_228 + lVar15) = 0;
          *(undefined1 (*) [16])((long)&local_268 + lVar15) = auVar22;
          *(undefined1 (*) [16])(auStack_25c + lVar15) = auVar22;
          *(undefined1 (*) [16])((long)&uStack_248 + lVar15) = auVar22;
          *(undefined1 (*) [16])(auStack_23c + lVar15) = auVar22;
          lVar15 = lVar15 + 0x48;
        } while (lVar15 != 0x1a8);
        piVar6 = (int *)CONCAT44(uStack_26c,uStack_270);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_228._12_4_,local_228._8_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if ((Allocator *)local_228._32_8_ == (Allocator *)0x0) {
              if ((void *)local_228._0_8_ != (void *)0x0) {
                free((void *)local_228._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_228._32_8_)[3])();
            }
          }
        }
        local_228._0_8_ = local_278;
        local_228._8_4_ = uStack_270;
        local_228._12_4_ = uStack_26c;
        local_228._16_4_ = local_268;
        local_228._20_4_ = uStack_264;
        local_228._24_4_ = local_260;
        local_228._32_8_ = local_258;
        uStack_1f8 = uStack_248;
        local_228._40_8_ = local_250;
        local_1f0[0] = local_240;
        local_1e8 = local_238;
        piVar6 = (int *)CONCAT44(uStack_2bc,uStack_2c0);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(uStack_1d4,uStack_1d8);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_1c0 == (Allocator *)0x0) {
              if (local_1e0 != (void *)0x0) {
                free(local_1e0);
              }
            }
            else {
              (*local_1c0->_vptr_Allocator[3])();
            }
          }
        }
        auVar23 = auVar31._0_16_;
        local_1e0 = local_2c8;
        uStack_1d8 = uStack_2c0;
        uStack_1d4 = uStack_2bc;
        uStack_1d0 = local_2b8;
        uStack_1cc = uStack_2b4;
        iStack_1c8 = local_2b0;
        local_1c0 = local_2a8;
        local_1b8._4_4_ = iStack_29c;
        local_1b8._0_4_ = uStack_2a0;
        uStack_1b0._4_4_ = uStack_294;
        uStack_1b0._0_4_ = uStack_298;
        local_1a8 = uStack_290;
        local_1a0 = local_288;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) != 0)
        {
          local_368.cstep = 0;
          local_368.data = (void *)0x0;
          local_368.refcount._0_4_ = 0;
          local_368.refcount._4_4_ = 0;
          local_368.elemsize._0_4_ = 0;
          local_368.elemsize._4_4_ = 0;
          local_368.elempack = 0;
          local_368.h = 0;
          local_368.d = 0;
          local_368.c = 0;
          local_368.allocator = (Allocator *)0x0;
          local_368.dims = 0;
          local_368.w = 0;
          Mat::create(&local_368,i,4,(Allocator *)0x0);
          uVar12 = local_368.c * (int)local_368.cstep;
          auVar7 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar8 = vpmovsxbq_avx2(ZEXT416(0x7060504));
          auVar9._8_8_ = uStack_50;
          auVar9._0_8_ = local_58;
          auVar9._16_8_ = uStack_48;
          auVar9._24_8_ = uStack_40;
          auVar31 = vpcmpeqd_avx2(auVar31,auVar31);
          auVar23 = auVar31._0_16_;
          if (0 < (int)uVar12) {
            lVar15 = (ulong)uVar12 - 1;
            auVar26._8_8_ = lVar15;
            auVar26._0_8_ = lVar15;
            auVar26._16_8_ = lVar15;
            auVar26._24_8_ = lVar15;
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) + lVar20 * 4);
            auVar24._4_4_ = uVar1;
            auVar24._0_4_ = uVar1;
            auVar24._8_4_ = uVar1;
            auVar24._12_4_ = uVar1;
            auVar24._16_4_ = uVar1;
            auVar24._20_4_ = uVar1;
            auVar24._24_4_ = uVar1;
            auVar24._28_4_ = uVar1;
            uVar17 = 0;
            do {
              auVar28._8_8_ = uVar17;
              auVar28._0_8_ = uVar17;
              auVar28._16_8_ = uVar17;
              auVar28._24_8_ = uVar17;
              auVar25 = vpor_avx2(auVar28,auVar7);
              auVar29 = vpor_avx2(auVar28,auVar8);
              auVar29 = vpcmpgtq_avx2(auVar29 ^ auVar9,auVar26 ^ auVar9);
              auVar25 = vpcmpgtq_avx2(auVar25 ^ auVar9,auVar26 ^ auVar9);
              auVar29 = vpackssdw_avx2(auVar25,auVar29);
              auVar22 = vpackssdw_avx(SUB3216(auVar29 ^ auVar31,0),SUB3216(auVar29 ^ auVar31,0x10));
              auVar22 = vpshufd_avx(auVar22,0xd8);
              auVar29 = vpmovzxwd_avx2(auVar22);
              auVar29 = vpslld_avx2(auVar29,0x1f);
              auVar29 = vmaskmovps_avx(auVar29,auVar24);
              *(undefined1 (*) [32])((long)local_368.data + uVar17 * 4) = auVar29;
              uVar17 = uVar17 + 8;
            } while ((uVar12 + 7 & 0xfffffff8) != uVar17);
          }
          piVar6 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          if (piStack_190 != (int *)0x0) {
            LOCK();
            *piStack_190 = *piStack_190 + -1;
            UNLOCK();
            if (*piStack_190 == 0) {
              if (local_178 == (Allocator *)0x0) {
                if (local_198 != (void *)0x0) {
                  free(local_198);
                }
              }
              else {
                (*local_178->_vptr_Allocator[3])();
              }
            }
          }
          ppvVar11 = local_a8;
          *(undefined8 *)((long)local_a8 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar11 + 0x14) = 0;
          *ppvVar11 = (void *)0x0;
          ppvVar11[1] = (void *)0x0;
          puVar10 = local_b0;
          *local_b0 = 0;
          puVar10[1] = 0;
          *(undefined4 *)(puVar10 + 2) = 0;
          piStack_190 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
          local_198 = local_368.data;
          uStack_188 = CONCAT44(local_368.elemsize._4_4_,(undefined4)local_368.elemsize);
          iStack_180 = local_368.elempack;
          local_178 = local_368.allocator;
          local_170[0] = CONCAT44(local_368.w,local_368.dims);
          local_170[1]._0_4_ = local_368.h;
          local_170[1]._4_4_ = local_368.d;
          local_160 = local_368.c;
          local_158 = local_368.cstep;
          p_Var5 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
          lVar15 = *(long *)(&this->field_0x250 + (long)p_Var5);
          local_318 = (void *)(lVar15 * lVar20 + *(long *)(&this->field_0x240 + (long)p_Var5));
          local_300 = *(int *)(&this->field_0x258 + (long)p_Var5);
          local_2f8 = *(Allocator **)(&this->field_0x260 + (long)p_Var5);
          uStack_310 = 0;
          uStack_30c = 0;
          local_308 = (undefined4)lVar15;
          uStack_304 = (undefined4)((ulong)lVar15 >> 0x20);
          local_2f0 = CONCAT44(iStack_94,local_98);
          uStack_2e8._4_4_ = iStack_8c;
          uStack_2e8._0_4_ = iStack_90;
          local_2e0 = 1;
          local_2d8 = 1;
          if (piStack_148 != (int *)0x0) {
            LOCK();
            *piStack_148 = *piStack_148 + -1;
            UNLOCK();
            if (*piStack_148 == 0) {
              if (local_130 == (Allocator *)0x0) {
                if (local_150 != (void *)0x0) {
                  free(local_150);
                }
              }
              else {
                (*local_130->_vptr_Allocator[3])();
              }
            }
          }
          ppvVar11 = local_b8;
          *(undefined8 *)((long)local_b8 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar11 + 0x14) = 0;
          *ppvVar11 = (void *)0x0;
          ppvVar11[1] = (void *)0x0;
          puVar10 = local_c0;
          *local_c0 = 0;
          puVar10[1] = 0;
          *(undefined4 *)(puVar10 + 2) = 0;
          piVar6 = (int *)CONCAT44(uStack_30c,uStack_310);
          local_150 = local_318;
          piStack_148 = (int *)CONCAT44(uStack_30c,uStack_310);
          uStack_140 = CONCAT44(uStack_304,local_308);
          iStack_138 = local_300;
          local_130 = local_2f8;
          local_128[0] = local_2f0;
          local_128[1]._0_4_ = (int)uStack_2e8;
          local_128[1]._4_4_ = uStack_2e8._4_4_;
          local_118 = local_2e0;
          local_110 = local_2d8;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_2f8 == (Allocator *)0x0) {
                if (local_318 != (void *)0x0) {
                  free(local_318);
                }
              }
              else {
                (*local_2f8->_vptr_Allocator[3])();
              }
            }
          }
          local_2d8 = 0;
          local_318 = (void *)0x0;
          uStack_310 = 0;
          uStack_30c = 0;
          local_308 = 0;
          uStack_304 = 0;
          local_300 = 0;
          local_2f0 = 0;
          uStack_2e8 = 0;
          local_2e0 = 0;
          piVar6 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_368.allocator == (Allocator *)0x0) {
                if (local_368.data != (void *)0x0) {
                  free(local_368.data);
                }
              }
              else {
                (*(local_368.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_368.cstep = 0;
          local_368.data = (void *)0x0;
          local_368.refcount._0_4_ = 0;
          local_368.refcount._4_4_ = 0;
          local_368.elemsize._0_4_ = 0;
          local_368.elemsize._4_4_ = 0;
          local_368.elempack = 0;
          local_368.dims = 0;
          local_368.w = 0;
          local_368.h = 0;
          local_368.d = 0;
          local_368.c = 0;
        }
        if (100 < *(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3])
           ) {
          p_Var5 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
          lVar15 = *(long *)(&this->field_0x298 + (long)p_Var5);
          local_368.data = (void *)(lVar15 * lVar20 + *(long *)(&this->field_0x288 + (long)p_Var5));
          local_368.elempack = *(int *)(&this->field_0x2a0 + (long)p_Var5);
          local_368.allocator = *(Allocator **)(&this->field_0x2a8 + (long)p_Var5);
          local_368.refcount._0_4_ = 0;
          local_368.refcount._4_4_ = 0;
          local_368.elemsize._0_4_ = (undefined4)lVar15;
          local_368.elemsize._4_4_ = (undefined4)((ulong)lVar15 >> 0x20);
          local_368.d = iStack_8c;
          local_368.h = iStack_90;
          local_368.dims = local_98;
          local_368.w = iStack_94;
          local_368.c = 1;
          local_368.cstep = 1;
          piVar6 = (int *)CONCAT44(uStack_fc,uStack_100);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_e8 == (Allocator *)0x0) {
                if (local_108 != (void *)0x0) {
                  free(local_108);
                }
              }
              else {
                (*local_e8->_vptr_Allocator[3])();
              }
            }
          }
          piVar6 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
          local_108 = local_368.data;
          uStack_100 = local_368.refcount._0_4_;
          uStack_fc = local_368.refcount._4_4_;
          uStack_f8 = (undefined4)local_368.elemsize;
          uStack_f4 = local_368.elemsize._4_4_;
          iStack_f0 = local_368.elempack;
          local_e8 = local_368.allocator;
          local_e0 = CONCAT44(local_368.w,local_368.dims);
          iStack_d8 = local_368.h;
          iStack_d4 = local_368.d;
          local_d0 = local_368.c;
          local_c8 = local_368.cstep;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_368.allocator == (Allocator *)0x0) {
                if (local_368.data != (void *)0x0) {
                  free(local_368.data);
                }
              }
              else {
                (*(local_368.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_368.cstep = 0;
          local_368.data = (void *)0x0;
          local_368.refcount._0_4_ = 0;
          local_368.refcount._4_4_ = 0;
          local_368.elemsize._0_4_ = 0;
          local_368.elemsize._4_4_ = 0;
          local_368.elempack = 0;
          local_368.dims = 0;
          local_368.w = 0;
          local_368.h = 0;
          local_368.d = 0;
          local_368.c = 0;
        }
        in_ZMM7 = ZEXT1664(auVar23);
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_368,(Mat *)local_228);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_368);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_368);
        lVar15 = 0x120;
        do {
          piVar6 = *(int **)(local_228 + lVar15 + 8);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (*(long **)(local_228 + lVar15 + 0x20) == (long *)0x0) {
                if (*(void **)(local_228 + lVar15) != (void *)0x0) {
                  free(*(void **)(local_228 + lVar15));
                }
              }
              else {
                (**(code **)(**(long **)(local_228 + lVar15 + 0x20) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_1e8 + lVar15) = 0;
          *(undefined8 *)(local_228 + lVar15 + 0xc) = 0;
          *(undefined8 *)(local_228 + lVar15 + 0x14) = 0;
          *(undefined8 *)(local_228 + lVar15) = 0;
          *(undefined8 *)(local_228 + lVar15 + 8) = 0;
          *(undefined8 *)(local_228 + lVar15 + 0x28) = 0;
          *(undefined8 *)((long)local_1f0 + lVar15 + -8) = 0;
          *(undefined4 *)((long)local_1f0 + lVar15) = 0;
          lVar15 = lVar15 + -0x48;
        } while (lVar15 != -0x48);
      }
      (*pLVar14->_vptr_Layer[4])(pLVar14,local_70);
      (local_a0->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar20] = pLVar14;
      ParamDict::~ParamDict(&local_68);
      piVar6 = (int *)CONCAT44(uStack_2bc,uStack_2c0);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_2a8 == (Allocator *)0x0) {
            if (local_2c8 != (void *)0x0) {
              free(local_2c8);
            }
          }
          else {
            (*local_2a8->_vptr_Allocator[3])();
          }
        }
      }
      local_288 = 0;
      local_2c8 = (void *)0x0;
      uStack_2c0 = 0;
      uStack_2bc = 0;
      local_2b8 = 0;
      uStack_2b4 = 0;
      local_2b0 = 0;
      uStack_2a0 = 0;
      iStack_29c = 0;
      uStack_298 = 0;
      uStack_294 = 0;
      uStack_290 = 0;
      piVar6 = (int *)CONCAT44(uStack_26c,uStack_270);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_258 == (Allocator *)0x0) {
            if (local_278 != (void *)0x0) {
              free(local_278);
            }
          }
          else {
            (*local_258->_vptr_Allocator[3])();
          }
        }
      }
      lVar20 = lVar20 + 1;
      pp_Var16 = this->_vptr_ConvolutionDepthWise_x86_avx2;
    } while (lVar20 < *(int *)(&this->field_0x108 + (long)pp_Var16[-3]));
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx2::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}